

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

ReturnStatementSyntax * __thiscall
slang::parsing::Parser::parseReturnStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  bool bVar1;
  ExpressionSyntax *returnValue;
  ReturnStatementSyntax *pRVar2;
  Token returnKeyword;
  Token semi;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  returnKeyword = ParserBase::consume(&this->super_ParserBase);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Semicolon);
  if (bVar1) {
    returnValue = (ExpressionSyntax *)0x0;
  }
  else {
    returnValue = parseExpression(this);
  }
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005a2b60;
  local_68.super_SyntaxListBase.childCount = attributes._M_extent._M_extent_value._M_extent_value;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attributes._M_ptr;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  pRVar2 = slang::syntax::SyntaxFactory::returnStatement
                     (&this->factory,label,&local_68,returnKeyword,returnValue,semi);
  return pRVar2;
}

Assistant:

ReturnStatementSyntax& Parser::parseReturnStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto keyword = consume();

    ExpressionSyntax* expr = nullptr;
    if (!peek(TokenKind::Semicolon))
        expr = &parseExpression();

    auto semi = expect(TokenKind::Semicolon);
    return factory.returnStatement(label, attributes, keyword, expr, semi);
}